

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

int Extra_FileCheck(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  int iVar2;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    iVar2 = 0;
    printf("Extra_FileCheck():  File \"%s\" does not exist.\n",pFileName);
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    if (lVar1 == 0) {
      printf("Extra_FileCheck():  File \"%s\" is empty.\n",pFileName);
    }
    fclose(__stream);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Extra_FileCheck( char * pFileName )
{
    FILE * pFile;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileCheck():  File \"%s\" does not exist.\n", pFileName );
        return 0;
    }
    fseek( pFile, 0, SEEK_END );
    if ( ftell( pFile ) == 0 )
        printf( "Extra_FileCheck():  File \"%s\" is empty.\n", pFileName );
    fclose( pFile );
    return 1;
}